

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaHash.c
# Opt level: O1

Vec_Int_t * Pla_ManComputeDistance1(Pla_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  timespec ts;
  timespec local_28;
  
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_28.tv_sec * -1000000;
  }
  pVVar2 = Pla_ManComputeDistance1Int(p);
  iVar1 = pVVar2->nSize;
  iVar4 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar4 = iVar1;
  }
  printf("Found %d pairs among %d cubes using cube hashing.  ",(ulong)(uint)(iVar4 >> 2),
         (ulong)(uint)(p->vCubes).nSize);
  iVar4 = 3;
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  Abc_Print(iVar4,"%s =","Time");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar5 + lVar3) / 1000000.0);
  return pVVar2;
}

Assistant:

Vec_Int_t * Pla_ManComputeDistance1( Pla_Man_t * p )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vPairs = Pla_ManComputeDistance1Int( p );
    printf( "Found %d pairs among %d cubes using cube hashing.  ", Vec_IntSize(vPairs)/4, Pla_ManCubeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vPairs;
}